

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChFunctionRotation::Get_w_loc
          (ChVector<double> *__return_storage_ptr__,ChFunctionRotation *this,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ChQuaternion<double> q0;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  (*this->_vptr_ChFunctionRotation[3])(&local_40);
  (*this->_vptr_ChFunctionRotation[3])(s + 1e-07,&local_60,this);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_40;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_60;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_30;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_50;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_28;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_48;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_38 * local_58;
  auVar5 = vfmadd231sd_fma(auVar23,auVar5,auVar14);
  auVar5 = vfmadd231sd_fma(auVar5,auVar9,auVar17);
  auVar5 = vfmadd231sd_fma(auVar5,auVar12,auVar20);
  if (auVar5._0_8_ < 0.0) {
    local_60 = -local_60;
    local_58 = -local_58;
    local_50 = -local_50;
    local_48 = -local_48;
  }
  dVar1 = (local_58 - local_38) * 10000000.0;
  dVar2 = (local_60 - local_40) * 10000000.0;
  dVar3 = (local_50 - local_30) * 10000000.0;
  dVar4 = (local_48 - local_28) * 10000000.0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_38 + local_38;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (local_40 + local_40) * dVar1;
  auVar5 = vfnmadd231sd_fma(auVar24,auVar7,auVar15);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_30 + local_30;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1 * (local_28 + local_28);
  auVar9 = vfnmsub231sd_fma(auVar25,auVar10,auVar15);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_28 + local_28;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar3;
  auVar5 = vfmadd231sd_fma(auVar5,auVar13,auVar18);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_40 + local_40;
  auVar9 = vfmadd231sd_fma(auVar9,auVar6,auVar18);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar4;
  auVar12 = vfnmadd231sd_fma(auVar5,auVar10,auVar21);
  auVar5 = vfmadd231sd_fma(auVar9,auVar7,auVar21);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (local_30 + local_30) * dVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2;
  auVar9 = vfnmadd231sd_fma(auVar11,auVar13,auVar16);
  __return_storage_ptr__->m_data[0] = auVar12._0_8_;
  __return_storage_ptr__->m_data[1] = auVar5._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_38 + local_38;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3;
  auVar5 = vfnmadd231sd_fma(auVar9,auVar8,auVar19);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar4;
  auVar5 = vfmadd231sd_fma(auVar5,auVar6,auVar22);
  __return_storage_ptr__->m_data[2] = auVar5._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionRotation::Get_w_loc(double s) const { 
		ChQuaternion<> q0 = Get_q(s);
		ChQuaternion<> q1 = Get_q(s + BDF_STEP_LOW);
		if (q0.Dot(q1) < 0)
			q1 = -q1; // because q1 and -q1 are the same rotation, but for finite difference we must use the closest to q0
		ChQuaternion<> qdt = (q1 - q0) / BDF_STEP_LOW;
		ChGlMatrix34<> Gl(q0);
        return Gl * qdt;
}